

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscretePure.h
# Opt level: O1

Interface_ProblemToPolicyDiscretePure * __thiscall
JointPolicyDiscretePure::GetInterfacePTPDiscretePure(JointPolicyDiscretePure *this)

{
  Interface_ProblemToPolicyDiscrete *pIVar1;
  Interface_ProblemToPolicyDiscretePure *pIVar2;
  
  pIVar1 = JointPolicyDiscrete::GetInterfacePTPDiscrete(&this->super_JointPolicyDiscrete);
  if (pIVar1 != (Interface_ProblemToPolicyDiscrete *)0x0) {
    pIVar2 = (Interface_ProblemToPolicyDiscretePure *)
             __dynamic_cast(pIVar1,&Interface_ProblemToPolicyDiscrete::typeinfo,
                            &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
    return pIVar2;
  }
  return (Interface_ProblemToPolicyDiscretePure *)0x0;
}

Assistant:

const Interface_ProblemToPolicyDiscretePure* 
            GetInterfacePTPDiscretePure() const
        {
            const Interface_ProblemToPolicyDiscrete* p =
                GetInterfacePTPDiscrete();
            const Interface_ProblemToPolicyDiscretePure* pp = 
                dynamic_cast<const Interface_ProblemToPolicyDiscretePure*>(p);
            return pp;
        }